

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cc
# Opt level: O0

void sptk::world::decimate(double *x,int x_length,int r,double *y)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  void *pvVar4;
  void *pvVar5;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  double *in_RDI;
  double *unaff_retaddr;
  int in_stack_00000008;
  int in_stack_0000000c;
  double *in_stack_00000010;
  int i_5;
  int count;
  int nbeg;
  int nout;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  double *tmp2;
  double *tmp1;
  int kNFact;
  int local_54;
  int local_50;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(in_ESI + 0x12);
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar3);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(in_ESI + 0x12);
  uVar3 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar3);
  for (local_34 = 0; local_34 < 9; local_34 = local_34 + 1) {
    *(double *)((long)pvVar4 + (long)local_34 * 8) = *in_RDI + *in_RDI + -in_RDI[9 - local_34];
  }
  for (local_38 = 9; local_38 < in_ESI + 9; local_38 = local_38 + 1) {
    *(double *)((long)pvVar4 + (long)local_38 * 8) = in_RDI[local_38 + -9];
  }
  for (local_3c = in_ESI + 9; local_3c < in_ESI + 0x12; local_3c = local_3c + 1) {
    *(double *)((long)pvVar4 + (long)local_3c * 8) =
         in_RDI[in_ESI + -1] + in_RDI[in_ESI + -1] + -in_RDI[in_ESI * 2 + (7 - local_3c)];
  }
  anon_unknown_4::FilterForDecimate
            (in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr);
  for (local_40 = 0; local_40 < in_ESI + 0x12; local_40 = local_40 + 1) {
    *(undefined8 *)((long)pvVar4 + (long)local_40 * 8) =
         *(undefined8 *)((long)pvVar5 + (long)((in_ESI - local_40) + 0x11) * 8);
  }
  anon_unknown_4::FilterForDecimate
            (in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr);
  for (local_44 = 0; local_44 < in_ESI + 0x12; local_44 = local_44 + 1) {
    *(undefined8 *)((long)pvVar4 + (long)local_44 * 8) =
         *(undefined8 *)((long)pvVar5 + (long)((in_ESI - local_44) + 0x11) * 8);
  }
  local_50 = 0;
  for (local_54 = (in_EDX - in_EDX * ((in_ESI + -1) / in_EDX + 1)) + in_ESI; local_54 < in_ESI + 9;
      local_54 = in_EDX + local_54) {
    *(undefined8 *)(in_RCX + (long)local_50 * 8) =
         *(undefined8 *)((long)pvVar4 + (long)(local_54 + 8) * 8);
    local_50 = local_50 + 1;
  }
  if (pvVar4 != (void *)0x0) {
    operator_delete__(pvVar4);
  }
  if (pvVar5 != (void *)0x0) {
    operator_delete__(pvVar5);
  }
  return;
}

Assistant:

void decimate(const double *x, int x_length, int r, double *y) {
  const int kNFact = 9;
  double *tmp1 = new double[x_length + kNFact * 2];
  double *tmp2 = new double[x_length + kNFact * 2];

  for (int i = 0; i < kNFact; ++i) tmp1[i] = 2 * x[0] - x[kNFact - i];
  for (int i = kNFact; i < kNFact + x_length; ++i) tmp1[i] = x[i - kNFact];
  for (int i = kNFact + x_length; i < 2 * kNFact + x_length; ++i)
    tmp1[i] = 2 * x[x_length - 1] - x[x_length - 2 - (i - (kNFact + x_length))];

  FilterForDecimate(tmp1, 2 * kNFact + x_length, r, tmp2);
  for (int i = 0; i < 2 * kNFact + x_length; ++i)
    tmp1[i] = tmp2[2 * kNFact + x_length - i - 1];
  FilterForDecimate(tmp1, 2 * kNFact + x_length, r, tmp2);
  for (int i = 0; i < 2 * kNFact + x_length; ++i)
    tmp1[i] = tmp2[2 * kNFact + x_length - i - 1];

  int nout = (x_length - 1) / r + 1;
  int nbeg = r - r * nout + x_length;

  int count = 0;
  for (int i = nbeg; i < x_length + kNFact; i += r)
    y[count++] = tmp1[i + kNFact - 1];

  delete[] tmp1;
  delete[] tmp2;
}